

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeBlock(void)

{
  Value *pVVar1;
  Ref RVar2;
  Ref local_18;
  Ref local_10;
  
  local_18 = makeRawArray(2);
  pVVar1 = Ref::operator->(&local_18);
  RVar2 = makeRawString((IString *)&BLOCK);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  RVar2 = makeRawArray(0);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  Ref::Ref(&local_10,pVVar1);
  return (Ref)local_10.inst;
}

Assistant:

static Ref makeBlock() {
    return &makeRawArray(2)
              ->push_back(makeRawString(BLOCK))
              .push_back(makeRawArray());
  }